

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasmMMU_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmPMove<(moira::Instr)184,(moira::Mode)8,0>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  int iVar2;
  Syntax SVar3;
  char *pcVar4;
  uint uVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  uint uVar9;
  char *pcVar10;
  long lVar11;
  char cVar12;
  char *pcVar13;
  Int i;
  Int i_00;
  Moira *this_00;
  uint uVar14;
  byte bVar15;
  ushort uVar16;
  uint uVar17;
  char *pcVar18;
  Ea<(moira::Mode)8,_2> result;
  u32 local_4c;
  ushort local_48;
  uint local_44;
  u32 *local_38;
  
  uVar1 = *addr;
  *addr = uVar1 + 2;
  this_00 = this;
  uVar9 = (*this->_vptr_Moira[6])();
  uVar14 = uVar9 & 0xffff;
  if (((str->style->syntax & ~MOIRA_MIT) == GNU) &&
     (bVar8 = isValidExtMMU(this_00,PMOVE,AL,op,uVar14), !bVar8)) {
    *addr = uVar1;
    dasmIllegal<(moira::Instr)184,(moira::Mode)8,0>(this,str,addr,op);
    return;
  }
  uVar16 = op & 7;
  uVar5 = uVar14 >> 0xd;
  uVar17 = uVar14 >> 10;
  pcVar18 = "%";
  pcVar13 = "";
  if ((str->style->syntax & ~GNU) != MOIRA_MIT) {
    pcVar18 = "";
  }
  pcVar10 = "fd";
  if ((uVar14 >> 8 & 1) == 0) {
    pcVar10 = "";
  }
  if (uVar5 != 3) {
    if (uVar5 == 2) {
      switch(uVar17 & 7) {
      case 0:
        pcVar13 = "tc";
        break;
      case 1:
        pcVar13 = "drp";
        break;
      case 2:
        pcVar13 = "srp";
        break;
      case 3:
        pcVar13 = "crp";
        break;
      case 4:
        pcVar13 = "cal";
        break;
      case 5:
        pcVar13 = "val";
        break;
      case 6:
        pcVar13 = "scc";
        break;
      case 7:
        pcVar13 = "ac";
      }
    }
    else {
      if (uVar5 != 0) {
LAB_003ecbb6:
        bVar8 = false;
        goto switchD_003ecbfc_default;
      }
      if ((uVar17 & 7) == 3) {
        pcVar13 = "tt1";
      }
      else {
        if ((uVar17 & 7) != 2) goto LAB_003ecbb6;
        pcVar13 = "tt0";
      }
    }
    bVar7 = true;
    bVar6 = false;
    goto switchD_003ecbfc_caseD_2;
  }
  bVar6 = false;
  bVar7 = false;
  bVar8 = false;
  switch(uVar17 & 7) {
  case 0:
    pcVar13 = "psr";
    break;
  case 1:
    pcVar13 = "pcsr";
    break;
  case 2:
  case 3:
    goto switchD_003ecbfc_caseD_2;
  case 4:
    pcVar13 = "bad";
    break;
  case 5:
    pcVar13 = "bac";
    break;
  default:
    goto switchD_003ecbfc_default;
  }
  bVar8 = true;
switchD_003ecbfc_default:
  bVar6 = bVar8;
  bVar7 = false;
switchD_003ecbfc_caseD_2:
  bVar15 = (byte)(uVar14 >> 2) & 7;
  cVar12 = 'p';
  lVar11 = 1;
  if ((uVar14 >> 9 & 1) == 0) {
    do {
      pcVar4 = str->ptr;
      str->ptr = pcVar4 + 1;
      *pcVar4 = cVar12;
      cVar12 = "pmove"[lVar11];
      lVar11 = lVar11 + 1;
    } while (lVar11 != 6);
    cVar12 = *pcVar10;
    while (cVar12 != '\0') {
      pcVar10 = pcVar10 + 1;
      pcVar4 = str->ptr;
      str->ptr = pcVar4 + 1;
      *pcVar4 = cVar12;
      cVar12 = *pcVar10;
    }
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar10 = str->ptr;
      str->ptr = pcVar10 + 1;
      *pcVar10 = ' ';
    }
    else {
      iVar2 = (str->tab).raw;
      do {
        pcVar10 = str->ptr;
        str->ptr = pcVar10 + 1;
        *pcVar10 = ' ';
      } while (str->ptr < str->base + iVar2);
    }
    if (bVar6) {
      local_4c = *addr;
      *addr = local_4c + 2;
      local_48 = uVar16;
      local_44 = (*this->_vptr_Moira[6])(this);
      local_44 = local_44 & 0xffff;
      uVar17 = local_44 << 0x10;
      *addr = *addr + 2;
      local_38 = addr;
      uVar14 = (*this->_vptr_Moira[6])(this);
      local_44 = uVar14 & 0xffff | uVar17;
      StrWriter::operator<<(str,(Ea<(moira::Mode)8,_2> *)&local_4c);
      pcVar10 = str->ptr;
      str->ptr = pcVar10 + 1;
      *pcVar10 = ',';
      SVar3 = str->style->syntax;
      addr = local_38;
      if ((SVar3 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar3 & 0x1f) & 1) != 0)) {
        pcVar10 = str->ptr;
        str->ptr = pcVar10 + 1;
        *pcVar10 = ' ';
      }
    }
    if (bVar7) {
      local_4c = *addr;
      *addr = local_4c + 2;
      local_48 = uVar16;
      local_44 = (*this->_vptr_Moira[6])(this);
      local_44 = local_44 & 0xffff;
      uVar17 = local_44 << 0x10;
      *addr = *addr + 2;
      uVar14 = (*this->_vptr_Moira[6])(this);
      local_44 = uVar14 & 0xffff | uVar17;
      StrWriter::operator<<(str,(Ea<(moira::Mode)8,_4> *)&local_4c);
      pcVar10 = str->ptr;
      str->ptr = pcVar10 + 1;
      *pcVar10 = ',';
      SVar3 = str->style->syntax;
      if ((SVar3 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar3 & 0x1f) & 1) != 0)) {
        pcVar10 = str->ptr;
        str->ptr = pcVar10 + 1;
        *pcVar10 = ' ';
      }
    }
    cVar12 = *pcVar18;
    while (cVar12 != '\0') {
      pcVar18 = pcVar18 + 1;
      pcVar10 = str->ptr;
      str->ptr = pcVar10 + 1;
      *pcVar10 = cVar12;
      cVar12 = *pcVar18;
    }
    cVar12 = *pcVar13;
    while (cVar12 != '\0') {
      pcVar13 = pcVar13 + 1;
      pcVar18 = str->ptr;
      str->ptr = pcVar18 + 1;
      *pcVar18 = cVar12;
      cVar12 = *pcVar13;
    }
    if ((uVar9 & 0x1800) != 0 && uVar5 == 3) {
      i.raw._1_3_ = 0;
      i.raw._0_1_ = bVar15;
      StrWriter::operator<<(str,i);
    }
  }
  else {
    do {
      pcVar4 = str->ptr;
      str->ptr = pcVar4 + 1;
      *pcVar4 = cVar12;
      cVar12 = "pmove"[lVar11];
      lVar11 = lVar11 + 1;
    } while (lVar11 != 6);
    cVar12 = *pcVar10;
    while (cVar12 != '\0') {
      pcVar10 = pcVar10 + 1;
      pcVar4 = str->ptr;
      str->ptr = pcVar4 + 1;
      *pcVar4 = cVar12;
      cVar12 = *pcVar10;
    }
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar10 = str->ptr;
      str->ptr = pcVar10 + 1;
      *pcVar10 = ' ';
    }
    else {
      iVar2 = (str->tab).raw;
      do {
        pcVar10 = str->ptr;
        str->ptr = pcVar10 + 1;
        *pcVar10 = ' ';
      } while (str->ptr < str->base + iVar2);
    }
    if ((uVar9 & 0x1800) != 0 && uVar5 == 3) {
      i_00.raw._1_3_ = 0;
      i_00.raw._0_1_ = bVar15;
      StrWriter::operator<<(str,i_00);
    }
    cVar12 = *pcVar18;
    while (cVar12 != '\0') {
      pcVar18 = pcVar18 + 1;
      pcVar10 = str->ptr;
      str->ptr = pcVar10 + 1;
      *pcVar10 = cVar12;
      cVar12 = *pcVar18;
    }
    cVar12 = *pcVar13;
    while (cVar12 != '\0') {
      pcVar13 = pcVar13 + 1;
      pcVar18 = str->ptr;
      str->ptr = pcVar18 + 1;
      *pcVar18 = cVar12;
      cVar12 = *pcVar13;
    }
    if (bVar6) {
      pcVar18 = str->ptr;
      str->ptr = pcVar18 + 1;
      *pcVar18 = ',';
      SVar3 = str->style->syntax;
      if ((SVar3 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar3 & 0x1f) & 1) != 0)) {
        pcVar18 = str->ptr;
        str->ptr = pcVar18 + 1;
        *pcVar18 = ' ';
      }
      local_4c = *addr;
      *addr = local_4c + 2;
      local_48 = uVar16;
      local_44 = (*this->_vptr_Moira[6])(this);
      local_44 = local_44 & 0xffff;
      uVar14 = local_44 << 0x10;
      *addr = *addr + 2;
      uVar9 = (*this->_vptr_Moira[6])(this);
      local_44 = uVar9 & 0xffff | uVar14;
      StrWriter::operator<<(str,(Ea<(moira::Mode)8,_2> *)&local_4c);
    }
    if (bVar7) {
      pcVar18 = str->ptr;
      str->ptr = pcVar18 + 1;
      *pcVar18 = ',';
      SVar3 = str->style->syntax;
      if ((SVar3 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar3 & 0x1f) & 1) != 0)) {
        pcVar18 = str->ptr;
        str->ptr = pcVar18 + 1;
        *pcVar18 = ' ';
      }
      local_4c = *addr;
      *addr = local_4c + 2;
      local_48 = uVar16;
      local_44 = (*this->_vptr_Moira[6])(this);
      local_44 = local_44 & 0xffff;
      uVar14 = local_44 << 0x10;
      *addr = *addr + 2;
      uVar9 = (*this->_vptr_Moira[6])(this);
      local_44 = uVar9 & 0xffff | uVar14;
      StrWriter::operator<<(str,(Ea<(moira::Mode)8,_4> *)&local_4c);
    }
  }
  return;
}

Assistant:

void
Moira::dasmPMove(StrWriter &str, u32 &addr, u16 op) const
{
    auto old  = addr;
    auto ext  = dasmIncRead<Word>(addr);
    auto reg  = _____________xxx (op);
    auto fmt  = xxx_____________ (ext);
    auto preg = ___xxx__________ (ext);
    auto nr   = ___________xxx__ (ext);

    // Catch illegal extension words
    if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

        if (!isValidExtMMU(I, M, op, ext)) {

            addr = old;
            dasmIllegal<I, M, S>(str, addr, op);
            return;
        }
    }

    const char *prefix = str.style.syntax == Syntax::GNU_MIT || str.style.syntax == Syntax::MOIRA_MIT ? "%" : "";
    const char *suffix = (ext & 0x100) ? "fd" : "";
    const char *r = "";
    Size s = Size(Unsized);

    switch (fmt) {

        case 0:

            switch (preg) {

                case 0b010: r = "tt0";  s = Long; break;
                case 0b011: r = "tt1";  s = Long; break;
            }
            break;

        case 2:

            switch (preg) {

                case 0b000: r = "tc";   s = Long; break;
                case 0b001: r = "drp";  s = Long; break;
                case 0b010: r = "srp";  s = Long; break;
                case 0b011: r = "crp";  s = Long; break;
                case 0b100: r = "cal";  s = Long; break;
                case 0b101: r = "val";  s = Long; break;
                case 0b110: r = "scc";  s = Long; break;
                case 0b111: r = "ac";   s = Long; break;
            }
            break;

        case 3:

            switch (preg) {

                case 0b000: r = "psr";  s = Word; break;
                case 0b001: r = "pcsr"; s = Word; break;
                case 0b100: r = "bad";  s = Word; break;
                case 0b101: r = "bac";  s = Word; break;
            }
            break;
    }

    if (!(ext & 0x200)) {

        str << Ins<I>{} << suffix << str.tab;
        if (s == Word) str << Op<M, Word>(reg, addr) << Sep{};
        if (s == Long) str << Op<M, Long>(reg, addr) << Sep{};
        str << prefix << r;
        if (fmt == 3 && preg > 1) str << Int(nr);

    } else {

        str << Ins<I>{} << suffix << str.tab;
        if (fmt == 3 && preg > 1) str << Int(nr);
        str << prefix << r;
        if (s == Word) str << Sep{} << Op<M, Word>(reg, addr);
        if (s == Long) str << Sep{} << Op<M, Long>(reg, addr);
    }
}